

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocket.c
# Opt level: O3

PSocketAddress * p_socket_get_remote_address(PSocket *socket,PError **error)

{
  int iVar1;
  PSocketAddress *pPVar2;
  socklen_t len;
  sockaddr_storage buffer;
  socklen_t local_8c;
  sockaddr local_88 [8];
  
  if (socket == (PSocket *)0x0) {
    p_socket_get_remote_address_cold_3();
  }
  else {
    local_8c = 0x80;
    iVar1 = getpeername(socket->fd,local_88,&local_8c);
    if (iVar1 < 0) {
      p_socket_get_remote_address_cold_2();
    }
    else {
      pPVar2 = p_socket_address_new_from_native(local_88,(ulong)local_8c);
      if (pPVar2 != (PSocketAddress *)0x0) {
        return pPVar2;
      }
      p_socket_get_remote_address_cold_1();
    }
  }
  return (PSocketAddress *)0x0;
}

Assistant:

P_LIB_API PSocketAddress *
p_socket_get_remote_address (const PSocket	*socket,
			     PError		**error)
{
	struct sockaddr_storage	buffer;
	socklen_t 		len;
	PSocketAddress		*ret;

	if (P_UNLIKELY (socket == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return NULL;
	}

	len = sizeof (buffer);

	if (P_UNLIKELY (getpeername (socket->fd, (struct sockaddr *) &buffer, &len) < 0)) {
		p_error_set_error_p (error,
				     (pint) p_error_get_io_from_system (p_error_get_last_net ()),
				     (pint) p_error_get_last_net (),
				     "Failed to call getpeername() to get remote socket address");
		return NULL;
	}

#ifdef P_OS_SYLLABLE
	/* Syllable has a bug with a wrong byte order for a TCP port,
	 * as it only supports IPv4 we can easily fix it here. */
	((struct sockaddr_in *) &buffer)->sin_port =
			p_htons (((struct sockaddr_in *) &buffer)->sin_port);
#endif

	ret = p_socket_address_new_from_native (&buffer, (psize) len);

	if (P_UNLIKELY (ret == NULL))
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_FAILED,
				     0,
				     "Failed to create socket address from native structure");

	return ret;
}